

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

void getSystemContentScale(float *xscale,float *yscale)

{
  int iVar1;
  long lVar2;
  double dVar3;
  char *local_48;
  char *type;
  XrmValue value;
  XrmDatabase db;
  char *rms;
  float ydpi;
  float xdpi;
  float *yscale_local;
  float *xscale_local;
  
  rms._4_4_ = 96.0;
  lVar2 = XResourceManagerString(_glfw.x11.display);
  if ((lVar2 != 0) &&
     (value.addr = (XPointer)XrmGetStringDatabase(lVar2), value.addr != (XPointer)0x0)) {
    local_48 = (char *)0x0;
    iVar1 = XrmGetResource(value.addr,"Xft.dpi","Xft.Dpi",&local_48,&type);
    if ((iVar1 != 0) &&
       ((local_48 != (char *)0x0 && (iVar1 = strcmp(local_48,"String"), iVar1 == 0)))) {
      dVar3 = atof((char *)value._0_8_);
      rms._4_4_ = (float)dVar3;
    }
    XrmDestroyDatabase(value.addr);
  }
  *xscale = rms._4_4_ / 96.0;
  *yscale = rms._4_4_ / 96.0;
  return;
}

Assistant:

static void getSystemContentScale(float* xscale, float* yscale)
{
    // Start by assuming the default X11 DPI
    // NOTE: Some desktop environments (KDE) may remove the Xft.dpi field when it
    //       would be set to 96, so assume that is the case if we cannot find it
    float xdpi = 96.f, ydpi = 96.f;

    // NOTE: Basing the scale on Xft.dpi where available should provide the most
    //       consistent user experience (matches Qt, Gtk, etc), although not
    //       always the most accurate one
    char* rms = XResourceManagerString(_glfw.x11.display);
    if (rms)
    {
        XrmDatabase db = XrmGetStringDatabase(rms);
        if (db)
        {
            XrmValue value;
            char* type = NULL;

            if (XrmGetResource(db, "Xft.dpi", "Xft.Dpi", &type, &value))
            {
                if (type && strcmp(type, "String") == 0)
                    xdpi = ydpi = atof(value.addr);
            }

            XrmDestroyDatabase(db);
        }
    }

    *xscale = xdpi / 96.f;
    *yscale = ydpi / 96.f;
}